

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtility.cpp
# Opt level: O0

void assert::expect_exception(function<void_()> *func,string *msg)

{
  string *in_RSI;
  string *in_RDI;
  undefined1 unaff_retaddr;
  bool exception_occured;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  string local_48 [55];
  undefined1 local_11;
  
  local_11 = 0;
  std::function<void_()>::operator()
            ((function<void_()> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  std::__cxx11::string::string(local_48,in_RSI);
  is_true((bool)unaff_retaddr,in_RDI);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void expect_exception(const std::function<void(void)>& func, std::string msg)
    {
        bool exception_occured = false;

        try
        {
            func();
        }
        catch (...)
        {
            exception_occured = true;
        }

        is_true(exception_occured, msg);
    }